

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O3

void __thiscall
USBAnalyzerResults::GenerateExportFileControlTransfers
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  string *psVar1;
  char cVar2;
  ulonglong uVar3;
  long *plVar4;
  ostream *poVar5;
  size_type *psVar6;
  _Alloc_hider _Var7;
  ulonglong uVar8;
  Frame f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  ofstream file_stream;
  string local_320;
  undefined2 local_300;
  uint local_2f4;
  string local_2f0;
  DisplayBase local_2cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c8;
  size_type sStack_2c0;
  size_type local_2b8;
  long lStack_2b0;
  undefined2 local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  USBStringContainer *local_278;
  string local_270;
  string local_250;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  local_2cc = display_base;
  std::ofstream::ofstream((ostream *)&local_230,file,_S_out);
  Analyzer::GetTriggerSample();
  Analyzer::GetSampleRate();
  Frame::Frame((Frame *)&local_2c8);
  uVar3 = AnalyzerResults::GetNumFrames();
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (uVar3 != 0) {
    local_278 = &this->mAllStringDescriptors;
    uVar8 = 0;
    local_2f4 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)&local_320);
      local_2a8 = local_300;
      local_2b8 = local_320.field_2._M_allocated_capacity;
      lStack_2b0 = local_320.field_2._8_8_;
      local_2c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_320._M_dataplus._M_p;
      sStack_2c0 = local_320._M_string_length;
      Frame::~Frame((Frame *)&local_320);
      cVar2 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar8);
      if (cVar2 != '\0') goto LAB_001314a3;
      if ((char)local_2a8 == '\x04') {
        local_2f4 = (USB_PID)local_2b8;
      }
      else {
        local_2f4 = local_2f4 & 0xff;
      }
      cVar2 = (char)(ostream *)&local_230;
      switch(local_2a8._1_1_) {
      case '\x02':
        std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
        std::ostream::put(cVar2);
        poVar5 = (ostream *)std::ostream::flush();
        int2str_sal_abi_cxx11_(&local_250,(ulong)(byte)local_2f4,local_2cc,7);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,0x13bdcc);
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_2f0.field_2._M_allocated_capacity = *psVar6;
          local_2f0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_2f0.field_2._M_allocated_capacity = *psVar6;
          local_2f0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_2f0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f0);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar6) {
          local_320.field_2._M_allocated_capacity = *psVar6;
          local_320.field_2._8_8_ = plVar4[3];
        }
        else {
          local_320.field_2._M_allocated_capacity = *psVar6;
          local_320._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_320._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_320._M_dataplus._M_p,local_320._M_string_length);
        GetSampleTimeStr_abi_cxx11_(&local_270,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p);
        }
        psVar1 = &local_250;
        _Var7._M_p = local_250._M_dataplus._M_p;
        goto LAB_00130ff0;
      case '\x03':
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"DATA time: ",0xb);
        GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      case '\x04':
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"Descriptor time: ",0x11);
        GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      default:
        goto switchD_00130cea_caseD_5;
      case '\b':
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"STATUS time: ",0xd);
        GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      psVar1 = &local_320;
      _Var7._M_p = local_320._M_dataplus._M_p;
LAB_00130ff0:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var7._M_p != &psVar1->field_2) {
        operator_delete(_Var7._M_p);
      }
switchD_00130cea_caseD_5:
      if (local_2a8._1_1_ == '\x01' || 1 < (byte)((char)local_2a8 - 0xdU)) {
        if ((char)local_2a8 == '\x06') {
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
          std::ostream::put(cVar2);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"USB RESET Time: ",0x10);
          GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,local_320._M_dataplus._M_p,local_320._M_string_length);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_320._M_dataplus._M_p != &local_320.field_2) {
            operator_delete(local_320._M_dataplus._M_p);
          }
          goto LAB_00131146;
        }
      }
      else {
        GetFrameDesc((Frame *)&local_2c8,local_2cc,&local_298,local_278);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,
                            ((local_298.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                            (local_298.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
LAB_00131146:
      }
      switch(local_2a8._1_1_) {
      case '\x05':
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"\t<data IN packet NAKed by device. Time: ",0x28);
        GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        local_2f0._M_dataplus._M_p._0_1_ = 0x3e;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2f0,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      case '\x06':
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"\t<data OUT packet NAKed by device. Time: ",0x29);
        GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        local_2f0._M_dataplus._M_p._0_1_ = 0x3e;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2f0,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      default:
        goto switchD_0013116a_caseD_7;
      case '\t':
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"\t<status OUT data packet NAKed by device. Time: ",0x30);
        GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        local_2f0._M_dataplus._M_p._0_1_ = 0x3e;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2f0,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      case '\n':
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"\t<status IN packet NAKed by device. Time: ",0x2a);
        GetSampleTimeStr_abi_cxx11_(&local_320,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        local_2f0._M_dataplus._M_p._0_1_ = 0x3e;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_2f0,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      case '\v':
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\t",1);
        GetPIDName_abi_cxx11_(&local_320,(USB_PID)local_2b8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        break;
      case '\f':
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"Unexpected packet ",0x12);
        GetPIDName_abi_cxx11_(&local_320,(USB_PID)local_2b8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,local_320._M_dataplus._M_p,
                            local_320._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,". Time: ",8);
        GetSampleTimeStr_abi_cxx11_(&local_2f0,this,(S64)local_2c8);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p);
      }
switchD_0013116a_caseD_7:
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar3);
LAB_001314a3:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  Frame::~Frame((Frame *)&local_2c8);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __Frame;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void USBAnalyzerResults::GenerateExportFileControlTransfers( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    Frame f;
    const U64 num_frames = GetNumFrames();
    std::vector<std::string> results;
    U8 address = 0;
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        if( f.mType == FT_AddrEndp )
            address = U8( f.mData1 );

        if( f.mFlags == FF_StatusBegin )
            file_stream << "STATUS time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_DataBegin )
            file_stream << "DATA time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_DataDescriptor )
            file_stream << "Descriptor time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        else if( f.mFlags == FF_SetupBegin )
            file_stream << std::endl
                        << "SETUP address: " + int2str_sal( address, display_base, 7 ) + " time: "
                        << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;

        if( ( f.mType == FT_ControlTransferField || f.mType == FT_HIDReportDescriptorItem ) && f.mFlags != FF_FieldIncomplete )
        {
            GetFrameDesc( f, display_base, results, mAllStringDescriptors );

            // output the packet
            file_stream << "\t" << results.front() << std::endl;
        }
        else if( f.mType == FT_Reset )
        {
            file_stream << std::endl << "USB RESET Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
        }

        if( f.mFlags == FF_StatusEnd )
            file_stream << "\t" << GetPIDName( USB_PID( f.mData1 ) ) << std::endl;
        else if( f.mFlags == FF_DataInNAKed )
            file_stream << "\t<data IN packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_DataOutNAKed )
            file_stream << "\t<data OUT packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_StatusInNAKed )
            file_stream << "\t<status IN packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_StatusOutNAKed )
            file_stream << "\t<status OUT data packet NAKed by device. Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << '>'
                        << std::endl;
        else if( f.mFlags == FF_UnexpectedPacket )
            file_stream << "Unexpected packet " << GetPIDName( USB_PID( f.mData1 ) )
                        << ". Time: " << GetSampleTimeStr( f.mStartingSampleInclusive ) << std::endl;
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}